

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ConcaveCornerOption __thiscall
ON_SubDFromMeshParameters::GetConcaveCornerOption(ON_SubDFromMeshParameters *this)

{
  ON_SubDFromMeshParameters *this_local;
  
  if (this->m_concave_corner_option < AtMeshCorner) {
    this_local._7_1_ = this->m_concave_corner_option;
  }
  else if ((((this->m_concave_corner_option != AtMeshCorner) ||
            (this->m_minimum_concave_corner_edge_count < 2)) ||
           (0xfff0 < this->m_minimum_concave_corner_edge_count)) ||
          ((this->m_minimum_concave_corner_angle_radians <= 3.141592653589793 ||
           (6.283185307179586 < this->m_minimum_concave_corner_angle_radians)))) {
    this_local._7_1_ = Unset;
  }
  else {
    this_local._7_1_ = this->m_concave_corner_option;
  }
  return this_local._7_1_;
}

Assistant:

ON_SubDFromMeshParameters::ConcaveCornerOption ON_SubDFromMeshParameters::GetConcaveCornerOption() const
{
  switch (m_concave_corner_option)
  {
  case ON_SubDFromMeshParameters::ConcaveCornerOption::Unset:
  case ON_SubDFromMeshParameters::ConcaveCornerOption::None:
    return m_concave_corner_option;

  case ON_SubDFromMeshParameters::ConcaveCornerOption::AtMeshCorner:
    if (m_minimum_concave_corner_edge_count >= 2
      && m_minimum_concave_corner_edge_count <= ON_SubDVertex::MaximumEdgeCount
      && m_minimum_concave_corner_angle_radians > ON_PI
      && m_minimum_concave_corner_angle_radians <= ON_2PI
      )
      return m_concave_corner_option;
    break;
  }

  return ON_SubDFromMeshParameters::ConcaveCornerOption::Unset;
}